

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O1

void __thiscall
helics::JsonTranslatorOperation::JsonTranslatorOperation(JsonTranslatorOperation *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_TranslatorOperations)._vptr_TranslatorOperations =
       (_func_int **)&PTR__JsonTranslatorOperation_005280b8;
  (this->to).super___shared_ptr<helics::JsonTranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005282b8;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[1]._M_use_count = 1;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__TranslatorOperator_00528128;
  (this->to).super___shared_ptr<helics::JsonTranslatorOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->to).super___shared_ptr<helics::JsonTranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  return;
}

Assistant:

JsonTranslatorOperation::JsonTranslatorOperation(): to(std::make_shared<JsonTranslatorOperator>())
{
}